

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O0

void __thiscall
duckdb::ColumnReader::PlainTemplatedInternal<bool,duckdb::BooleanParquetValueConversion,true,false>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t result_offset,Vector *result)

{
  bool bVar1;
  bool *pbVar2;
  ByteBuffer *plain_data_00;
  ulong row_idx_00;
  idx_t iVar3;
  long in_RCX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  ColumnReader *in_RDI;
  ColumnReader *in_R8;
  idx_t row_idx;
  ValidityMask *result_mask;
  bool *result_ptr;
  ColumnReader *reader;
  
  pbVar2 = FlatVector::GetData<bool>((Vector *)0x229f636);
  plain_data_00 = (ByteBuffer *)FlatVector::Validity((Vector *)0x229f645);
  for (reader = in_R8; reader < (ColumnReader *)((long)&in_R8->_vptr_ColumnReader + in_RCX);
      reader = (ColumnReader *)((long)&reader->_vptr_ColumnReader + 1)) {
    row_idx_00 = (ulong)*(byte *)((long)&reader->_vptr_ColumnReader +
                                 CONCAT71(in_register_00000011,in_DL));
    iVar3 = MaxDefine(in_RDI);
    if (row_idx_00 == iVar3) {
      bVar1 = BooleanParquetValueConversion::PlainRead<false>(plain_data_00,reader);
      pbVar2[(long)reader] = bVar1;
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                ((TemplatedValidityMask<unsigned_long> *)in_RDI,row_idx_00);
    }
  }
  return;
}

Assistant:

void PlainTemplatedInternal(ByteBuffer &plain_data, const uint8_t *__restrict defines, const uint64_t num_values,
	                            const idx_t result_offset, Vector &result) {
		const auto result_ptr = FlatVector::GetData<VALUE_TYPE>(result);
		if (!HAS_DEFINES && !CHECKED && CONVERSION::PlainConstantSize() == sizeof(VALUE_TYPE)) {
			// we can memcpy
			idx_t copy_count = num_values * CONVERSION::PlainConstantSize();
			memcpy(result_ptr + result_offset, plain_data.ptr, copy_count);
			plain_data.unsafe_inc(copy_count);
			return;
		}
		auto &result_mask = FlatVector::Validity(result);
		for (idx_t row_idx = result_offset; row_idx < result_offset + num_values; row_idx++) {
			if (HAS_DEFINES && defines[row_idx] != MaxDefine()) {
				result_mask.SetInvalid(row_idx);
				continue;
			}
			result_ptr[row_idx] = CONVERSION::template PlainRead<CHECKED>(plain_data, *this);
		}
	}